

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3FuncDefInsert(FuncDefHash *pHash,FuncDef *pDef)

{
  byte *z;
  ulong uVar1;
  int nFunc;
  FuncDef *pFVar2;
  FuncDef **ppFVar3;
  long lStack_30;
  
  z = (byte *)pDef->zName;
  nFunc = sqlite3Strlen30((char *)z);
  uVar1 = (ulong)((uint)""[*z] + nFunc) % 0x17;
  pFVar2 = functionSearch(pHash,(int)uVar1,(char *)z,nFunc);
  if (pFVar2 == (FuncDef *)0x0) {
    pDef->pNext = (FuncDef *)0x0;
    ppFVar3 = pHash->a + uVar1;
    lStack_30 = 0x38;
  }
  else {
    ppFVar3 = &pFVar2->pNext;
    lStack_30 = 0x10;
  }
  *(FuncDef **)((long)&pDef->nArg + lStack_30) = *ppFVar3;
  *ppFVar3 = pDef;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FuncDefInsert(
  FuncDefHash *pHash,  /* The hash table into which to insert */
  FuncDef *pDef        /* The function definition to insert */
){
  FuncDef *pOther;
  int nName = sqlite3Strlen30(pDef->zName);
  u8 c1 = (u8)pDef->zName[0];
  int h = (sqlite3UpperToLower[c1] + nName) % ArraySize(pHash->a);
  pOther = functionSearch(pHash, h, pDef->zName, nName);
  if( pOther ){
    assert( pOther!=pDef && pOther->pNext!=pDef );
    pDef->pNext = pOther->pNext;
    pOther->pNext = pDef;
  }else{
    pDef->pNext = 0;
    pDef->pHash = pHash->a[h];
    pHash->a[h] = pDef;
  }
}